

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Exception> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Exception,wabt::interp::Store&,wabt::interp::Ref&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&>
          (RefPtr<wabt::interp::Exception> *__return_storage_ptr__,Store *this,Store *args,
          Ref *args_1,vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *args_2)

{
  size_t sVar1;
  Exception *pEVar2;
  Ref ref;
  Exception *local_38;
  
  pEVar2 = (Exception *)operator_new(0x60);
  sVar1 = args_1->index;
  (pEVar2->super_Object).kind_ = Exception;
  (pEVar2->super_Object).host_info_ = (void *)0x0;
  (pEVar2->super_Object).self_.index = 0;
  (pEVar2->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (pEVar2->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(pEVar2->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pEVar2->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (pEVar2->super_Object)._vptr_Object = (_func_int **)&PTR__Exception_00183eb8;
  (pEVar2->tag_).index = sVar1;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            (&pEVar2->args_,args_2);
  local_38 = pEVar2;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Exception*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_38);
  RefPtr<wabt::interp::Exception>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Object).self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}